

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall
TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_>::~TPZVec
          (TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_> *this)

{
  function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *pfVar1;
  _Invoker_type p_Var2;
  long lVar3;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_0172e660;
  pfVar1 = this->fStore;
  if (pfVar1 != (function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)0x0) {
    p_Var2 = pfVar1[-1]._M_invoker;
    if (p_Var2 != (_Invoker_type)0x0) {
      lVar3 = (long)p_Var2 << 5;
      do {
        std::_Function_base::~_Function_base
                  ((_Function_base *)((long)&pfVar1[-1].super__Function_base._M_functor + lVar3));
        lVar3 = lVar3 + -0x20;
      } while (lVar3 != 0);
    }
    operator_delete__(&pfVar1[-1]._M_invoker,(long)p_Var2 << 5 | 8);
    return;
  }
  return;
}

Assistant:

inline TPZVec<T>::~TPZVec() {
	if( fStore )
	{
		delete [] fStore;
	}
}